

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

Matrix_Sparse_Row<Disa::Matrix_Sparse> __thiscall
Disa::Matrix_Sparse::operator[](Matrix_Sparse *this,size_t *i_row)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  ulong *in_RDX;
  size_t extraout_RDX;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> MVar3;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ulong *local_20;
  size_t *i_row_local;
  Matrix_Sparse *this_local;
  
  psVar1 = (source_location *)*in_RDX;
  local_20 = in_RDX;
  i_row_local = i_row;
  this_local = this;
  location = (source_location *)size_row((Matrix_Sparse *)i_row);
  if (location <= psVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b7d30;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::__cxx11::to_string(&local_f8,*local_20);
    std::operator+(&local_d8,"Row ",&local_f8);
    std::operator+(&local_b8,&local_d8," not in range ");
    range_row_abi_cxx11_(&local_118,(Matrix_Sparse *)i_row);
    std::operator+(&local_98,&local_b8,&local_118);
    std::operator+(&local_78,&local_98,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_78);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  Matrix_Sparse_Row<Disa::Matrix_Sparse>::Matrix_Sparse_Row
            ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)this,*local_20,(matrix_type *)i_row);
  MVar3.row_index = extraout_RDX;
  MVar3.matrix = this;
  return MVar3;
}

Assistant:

Matrix_Sparse_Row<Matrix_Sparse> Matrix_Sparse::operator[](const std::size_t& i_row) {
  ASSERT_DEBUG(i_row < size_row(), "Row " + std::to_string(i_row) + " not in range " + range_row() + ".");
  return {i_row, this};
}